

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_config(fglrx_ioctl_config *d,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_78;
  mmt_buf *__ret_3;
  mmt_buf *data4;
  mmt_buf *local_60;
  mmt_buf *__ret_2;
  mmt_buf *data3;
  mmt_buf *local_48;
  mmt_buf *__ret_1;
  mmt_buf *data2;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *data1;
  int argc_local;
  mmt_memory_dump *args_local;
  fglrx_ioctl_config *d_local;
  
  if ((d->unk00 != 0) || (iVar1 = _fglrx_field_enabled("unk00"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)d->unk00);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk04 != 0) || (iVar1 = _fglrx_field_enabled("unk04"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk04: 0x%08x",fglrx_pfx,(ulong)d->unk04);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk08 != 0) || (iVar1 = _fglrx_field_enabled("unk08"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk08: 0x%08x",fglrx_pfx,(ulong)d->unk08);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->username_len != 0) || (iVar1 = _fglrx_field_enabled("username_len"), iVar1 != 0)) {
    fprintf(_stdout,"%susername_len: %d",fglrx_pfx,(ulong)d->username_len);
  }
  fglrx_pfx = fglrx_sep;
  local_30 = (mmt_buf *)0x0;
  if ((d->username != 0) || (iVar1 = _fglrx_field_enabled("username"), iVar1 != 0)) {
    if (d->username == 0) {
      fprintf(_stdout,"%susername: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%susername: 0x%016lx",fglrx_pfx,d->username);
      if (0 < argc) {
        local_30 = find_ptr(d->username,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->namespace_len != 0) || (iVar1 = _fglrx_field_enabled("namespace_len"), iVar1 != 0)) {
    fprintf(_stdout,"%snamespace_len: %d",fglrx_pfx,(ulong)d->namespace_len);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad1c != 0) {
    fprintf(_stdout,"%s%s_pad1c: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad1c,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_48 = (mmt_buf *)0x0;
  if ((d->namespace != 0) || (iVar1 = _fglrx_field_enabled("namespace"), iVar1 != 0)) {
    if (d->namespace == 0) {
      fprintf(_stdout,"%snamespace: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%snamespace: 0x%016lx",fglrx_pfx,d->namespace);
      if (0 < argc) {
        local_48 = find_ptr(d->namespace,args,argc);
      }
      if (local_48 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->prop_name_len != 0) || (iVar1 = _fglrx_field_enabled("prop_name_len"), iVar1 != 0)) {
    fprintf(_stdout,"%sprop_name_len: %d",fglrx_pfx,(ulong)d->prop_name_len);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad2c != 0) {
    fprintf(_stdout,"%s%s_pad2c: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad2c,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_60 = (mmt_buf *)0x0;
  if ((d->prop_name != 0) || (iVar1 = _fglrx_field_enabled("prop_name"), iVar1 != 0)) {
    if (d->prop_name == 0) {
      fprintf(_stdout,"%sprop_name: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sprop_name: 0x%016lx",fglrx_pfx,d->prop_name);
      if (0 < argc) {
        local_60 = find_ptr(d->prop_name,args,argc);
      }
      if (local_60 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk38 != 0) || (iVar1 = _fglrx_field_enabled("unk38"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk38: 0x%08x",fglrx_pfx,(ulong)d->unk38);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk3c != 0) || (iVar1 = _fglrx_field_enabled("unk3c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk3c: 0x%08x",fglrx_pfx,(ulong)d->unk3c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk40 != 0) || (iVar1 = _fglrx_field_enabled("unk40"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk40: 0x%08x",fglrx_pfx,(ulong)d->unk40);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk44 != 0) || (iVar1 = _fglrx_field_enabled("unk44"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk44: 0x%08x",fglrx_pfx,(ulong)d->unk44);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk48 != 0) || (iVar1 = _fglrx_field_enabled("unk48"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk48: 0x%08x",fglrx_pfx,(ulong)d->unk48);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk4c != 0) || (iVar1 = _fglrx_field_enabled("unk4c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk4c: 0x%08x",fglrx_pfx,(ulong)d->unk4c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->prop_value_len != 0) || (iVar1 = _fglrx_field_enabled("prop_value_len"), iVar1 != 0)) {
    fprintf(_stdout,"%sprop_value_len: %d",fglrx_pfx,(ulong)d->prop_value_len);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad54 != 0) {
    fprintf(_stdout,"%s%s_pad54: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad54,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_78 = (mmt_buf *)0x0;
  if ((d->prop_value != 0) || (iVar1 = _fglrx_field_enabled("prop_value"), iVar1 != 0)) {
    if (d->prop_value == 0) {
      fprintf(_stdout,"%sprop_value: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sprop_value: 0x%016lx",fglrx_pfx,d->prop_value);
      if (0 < argc) {
        local_78 = find_ptr(d->prop_value,args,argc);
      }
      if (local_78 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_30,"username");
  }
  if (local_48 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_48,"namespace");
  }
  if (local_60 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_60,"prop_name");
  }
  if (local_78 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_78,"prop_value");
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_config(struct fglrx_ioctl_config *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_d32(d, username_len);
	struct mmt_buf *data1 = fglrx_print_ptr(d, username, args, argc);
	fglrx_print_d32(d, namespace_len);
	fglrx_print_pad_x32(d, _pad1c);
	struct mmt_buf *data2 = fglrx_print_ptr(d, namespace, args, argc);
	fglrx_print_d32(d, prop_name_len);
	fglrx_print_pad_x32(d, _pad2c);
	struct mmt_buf *data3 = fglrx_print_ptr(d, prop_name, args, argc);
	fglrx_print_x32(d, unk38);
	fglrx_print_x32(d, unk3c);
	fglrx_print_x32(d, unk40);
	fglrx_print_x32(d, unk44);
	fglrx_print_x32(d, unk48);
	fglrx_print_x32(d, unk4c);
	fglrx_print_d32(d, prop_value_len);
	fglrx_print_pad_x32(d, _pad54);
	struct mmt_buf *data4 = fglrx_print_ptr(d, prop_value, args, argc);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_text(data1, "username");
	if (data2)
		dump_mmt_buf_as_text(data2, "namespace");
	if (data3)
		dump_mmt_buf_as_text(data3, "prop_name");
	if (data4)
		dump_mmt_buf_as_text(data4, "prop_value");
}